

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O2

int find(char *name)

{
  char cVar1;
  char cVar2;
  short sVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  
  cVar1 = *name;
  if (cVar1 == '\0') {
    iVar6 = 0;
    sVar3 = 1;
  }
  else {
    cVar2 = name[1];
    if (cVar2 == '\0') {
      iVar6 = (int)(short)cVar1;
      sVar3 = cVar1 * 3;
    }
    else {
      if (name[2] == '\0') {
        iVar6 = cVar1 * 0x1f + (int)cVar2;
      }
      else {
        iVar6 = cVar2 * 0x1f + cVar1 * 0x47 + (int)name[2];
      }
      sVar3 = cVar2 * 3 + cVar1 * 0x33;
    }
  }
  uVar4 = 1;
  if (1 < (ushort)(sVar3 % 0xd3)) {
    uVar4 = sVar3 % 0xd3;
  }
  while( true ) {
    iVar6 = iVar6 % 0xd3;
    if (symbols[iVar6].notempty == '\0') {
      return iVar6;
    }
    iVar5 = strcmp(symbols[iVar6].name,name);
    if (iVar5 == 0) break;
    iVar6 = iVar6 + (short)uVar4;
  }
  return iVar6;
}

Assistant:

static int find(const char *name) {
// returns hash entry if it exists, or first empty slot:
  int pos = name[0] ? (
    name[1] ? (
      name[2] ? 71*name[0]+31*name[1]+name[2] : 31*name[0]+name[1]
    ) :
      name[0]
  ) : 0;
  pos %= MAXSYMBOL;
  int hh2 = name[0] ? (
    (name[1]) ? 51*name[0]+3*name[1] : 3*name[0]
    ) : 1;
  hh2 %= MAXSYMBOL; if (!hh2) hh2 = 1;
  for (;;) {
    if (!symbols[pos].notempty) return pos;
    if (!strcmp(symbols[pos].name,name)) return pos;
    pos = (pos + hh2) % MAXSYMBOL;
  }
}